

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

vec2 __thiscall djb::tab::cdfv(tab *this,vec2 *u,vec3 *wi)

{
  long lVar1;
  vec2 vVar2;
  vec2 vVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  float fVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dc_04;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 extraout_XMM0_Dd_04;
  float fVar13;
  float fVar14;
  float fVar15;
  float local_e8;
  float fStack_e4;
  float local_d0;
  int l2;
  float_t w3;
  float_t w2;
  float_t w1;
  int i2;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [8];
  undefined8 uStack_90;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  undefined1 local_78 [8];
  undefined8 uStack_70;
  undefined1 local_68 [8];
  undefined8 uStack_60;
  vec2 *local_58;
  vec2 *local_50;
  int l1;
  int k2;
  int k1;
  int j2;
  int j1;
  int i1;
  
  uStack_70 = local_78;
  uStack_90 = local_98;
  uStack_80 = local_88;
  uStack_60 = local_68;
  local_68 = (undefined1  [8])this;
  fVar12 = wi->z;
  fVar13 = 0.0;
  if (fVar12 < 1.0) {
    fVar13 = atan2f(wi->y,wi->x);
    fVar12 = wi->z;
  }
  local_b8._0_4_ = u->x;
  local_a8._0_4_ = u->y;
  fVar12 = acosf(fVar12);
  spline::uwrap_edge((float_t)local_b8._0_4_,0x200,&i1,&i2,&w1);
  spline::uwrap_edge((float_t)local_a8._0_4_,0x40,&j1,&j2,&w2);
  spline::uwrap_edge(fVar12 * 0.63661975 * fVar12 * 0.63661975,0x10,&k1,&k2,&w3);
  spline::uwrap_repeat((fVar13 / 3.1415927 + 1.0) * 0.5,0x20,&l1,&l2,&local_d0);
  iVar4 = l1 * 0x400 + k1 * 0x40;
  iVar5 = (iVar4 + j1) * 0x200;
  iVar8 = (iVar4 + j2) * 0x200;
  iVar6 = l1 * 0x400 + k2 * 0x40;
  iVar11 = (iVar6 + j1) * 0x200;
  iVar4 = k1 * 0x40 + l2 * 0x400;
  iVar9 = l2 * 0x400 + k2 * 0x40;
  iVar7 = (iVar6 + j2) * 0x200;
  iVar10 = (iVar4 + j1) * 0x200;
  iVar6 = (iVar4 + j2) * 0x200;
  iVar4 = (j1 + iVar9) * 0x200;
  iVar9 = (iVar9 + j2) * 0x200;
  lVar1 = *(long *)((long)local_68 + 0x28);
  local_88 = (undefined1  [8])(lVar1 + (long)(iVar8 + i1) * 8);
  local_58 = (vec2 *)(lVar1 + (long)(iVar8 + i2) * 8);
  local_a8._0_8_ = lVar1 + (long)(iVar11 + i1) * 8;
  local_98 = (undefined1  [8])(lVar1 + (long)(iVar7 + i1) * 8);
  local_50 = (vec2 *)(lVar1 + (long)(iVar7 + i2) * 8);
  local_b8._0_8_ = lVar1 + (long)(iVar10 + i1) * 8;
  local_78 = (undefined1  [8])(lVar1 + (long)(iVar10 + i2) * 8);
  vVar2 = spline::lerp<djb::vec2>
                    ((vec2 *)(lVar1 + (long)(iVar5 + i1) * 8),
                     (vec2 *)(lVar1 + (long)(iVar5 + i2) * 8),w1);
  unique0x1000008e = extraout_XMM0_Dc;
  local_68._0_4_ = vVar2.x;
  local_68._4_4_ = vVar2.y;
  unique0x10000092 = extraout_XMM0_Dd;
  vVar2 = spline::lerp<djb::vec2>((vec2 *)local_88,local_58,w1);
  unique0x100000b2 = extraout_XMM0_Dc_00;
  local_88._0_4_ = vVar2.x;
  local_88._4_4_ = vVar2.y;
  unique0x100000b6 = extraout_XMM0_Dd_00;
  vVar2 = spline::lerp<djb::vec2>
                    ((vec2 *)local_a8._0_8_,(vec2 *)(lVar1 + (long)(iVar11 + i2) * 8),w1);
  local_a8._8_4_ = extraout_XMM0_Dc_01;
  local_a8._0_4_ = vVar2.x;
  local_a8._4_4_ = vVar2.y;
  local_a8._12_4_ = extraout_XMM0_Dd_01;
  vVar2 = spline::lerp<djb::vec2>((vec2 *)local_98,local_50,w1);
  unique0x100000fa = extraout_XMM0_Dc_02;
  local_98._0_4_ = vVar2.x;
  local_98._4_4_ = vVar2.y;
  unique0x100000fe = extraout_XMM0_Dd_02;
  vVar2 = spline::lerp<djb::vec2>((vec2 *)local_b8._0_8_,(vec2 *)local_78,w1);
  local_b8._8_4_ = extraout_XMM0_Dc_03;
  local_b8._0_4_ = vVar2.x;
  local_b8._4_4_ = vVar2.y;
  local_b8._12_4_ = extraout_XMM0_Dd_03;
  vVar2 = spline::lerp<djb::vec2>
                    ((vec2 *)(lVar1 + (long)(iVar6 + i1) * 8),
                     (vec2 *)(lVar1 + (long)(iVar6 + i2) * 8),w1);
  vVar3 = spline::lerp<djb::vec2>
                    ((vec2 *)(lVar1 + (long)(iVar4 + i1) * 8),
                     (vec2 *)(lVar1 + (long)(iVar4 + i2) * 8),w1);
  unique0x10000166 = extraout_XMM0_Dc_04;
  local_78._0_4_ = vVar3.x;
  local_78._4_4_ = vVar3.y;
  unique0x1000016a = extraout_XMM0_Dd_04;
  vVar3 = spline::lerp<djb::vec2>
                    ((vec2 *)(lVar1 + (long)(i1 + iVar9) * 8),
                     (vec2 *)(lVar1 + (long)(iVar9 + i2) * 8),w1);
  fVar12 = ((float)local_88._0_4_ - (float)local_68._0_4_) * w2 + (float)local_68._0_4_;
  fVar13 = ((float)local_88._4_4_ - (float)local_68._4_4_) * w2 + (float)local_68._4_4_;
  local_e8 = vVar2.x;
  fStack_e4 = vVar2.y;
  fVar14 = (local_e8 - (float)local_b8._0_4_) * w2 + (float)local_b8._0_4_;
  fVar15 = (fStack_e4 - (float)local_b8._4_4_) * w2 + (float)local_b8._4_4_;
  fVar12 = ((((float)local_98._0_4_ - (float)local_a8._0_4_) * w2 + (float)local_a8._0_4_) - fVar12)
           * w3 + fVar12;
  fVar13 = ((((float)local_98._4_4_ - (float)local_a8._4_4_) * w2 + (float)local_a8._4_4_) - fVar13)
           * w3 + fVar13;
  vVar2.y = (((((vVar3.y - (float)local_78._4_4_) * w2 + (float)local_78._4_4_) - fVar15) * w3 +
             fVar15) - fVar13) * local_d0 + fVar13;
  vVar2.x = (((((vVar3.x - (float)local_78._0_4_) * w2 + (float)local_78._0_4_) - fVar14) * w3 +
             fVar14) - fVar12) * local_d0 + fVar12;
  return vVar2;
}

Assistant:

vec2 tab::cdfv(const vec2 &u, const vec3 &wi) const
{
	int res1 = 512;
	int res2 = 64;
	int res3 = 16;
	int res4 = 32;
	float_t pi = wi.z < 1 ? atan2(wi.y, wi.x) : 0;
	float_t u1 = u.x;
	float_t u2 = u.y;
	float_t u3 = sqr(acos(wi.z) * (2 / m_pi()));
	float_t u4 = (pi / m_pi() + 1) / 2;

	return spline::eval4d(m_cdf,
	                      res1, res2, res3, res4,
	                      spline::uwrap_edge  , u1,
	                      spline::uwrap_edge  , u2,
	                      spline::uwrap_edge  , u3,
	                      spline::uwrap_repeat, u4);
}